

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setparamscheck(HSQUIRRELVM v,SQInteger nparamscheck,SQChar *typemask)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQTable *pSVar3;
  long in_RDX;
  EVP_PKEY_CTX *src;
  SQTable *in_RSI;
  SQIntVec res;
  SQNativeClosure *nc;
  SQObject o;
  SQChar *in_stack_ffffffffffffff78;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  SQUnsignedInteger in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  SQIntVec *in_stack_ffffffffffffff98;
  sqvector<long_long> local_50;
  SQTable *local_38;
  undefined8 local_30;
  SQTable *local_28;
  long local_20;
  SQTable *local_18;
  HSQUIRRELVM local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pSVar2 = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  local_30 = *(undefined8 *)&pSVar2->super_SQObject;
  local_38 = (pSVar2->super_SQObject)._unVal.pTable;
  local_28 = local_38;
  if ((int)local_30 == 0x8000200) {
    (local_38->super_SQDelegable)._delegate = local_18;
    if (local_20 == 0) {
      sqvector<long_long>::resize
                ((sqvector<long_long> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,(longlong *)in_stack_ffffffffffffff80);
    }
    else {
      sqvector<long_long>::sqvector(&local_50);
      bVar1 = CompileTypemask(in_stack_ffffffffffffff98,
                              (SQChar *)
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      if (bVar1) {
        sqvector<long_long>::copy
                  ((sqvector<long_long> *)&local_38->_firstfree,(EVP_PKEY_CTX *)&local_50,src);
      }
      else {
        in_stack_ffffffffffffff80 =
             (HSQUIRRELVM)sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_8 = in_stack_ffffffffffffff80;
      }
      sqvector<long_long>::~sqvector((sqvector<long_long> *)in_stack_ffffffffffffff80);
      if (!bVar1) {
        return (SQRESULT)local_8;
      }
    }
    if (local_18 == (SQTable *)0xfffffffffffe7961) {
      pSVar3 = (SQTable *)sqvector<long_long>::size((sqvector<long_long> *)&local_38->_firstfree);
      (local_38->super_SQDelegable)._delegate = pSVar3;
    }
    local_8 = (HSQUIRRELVM)0x0;
  }
  else {
    local_8 = (HSQUIRRELVM)sq_throwerror(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return (SQRESULT)local_8;
}

Assistant:

SQRESULT sq_setparamscheck(HSQUIRRELVM v,SQInteger nparamscheck,const SQChar *typemask)
{
    SQObject o = stack_get(v, -1);
    if(!sq_isnativeclosure(o))
        return sq_throwerror(v, _SC("native closure expected"));
    SQNativeClosure *nc = _nativeclosure(o);
    nc->_nparamscheck = nparamscheck;
    if(typemask) {
        SQIntVec res;
        if(!CompileTypemask(res, typemask))
            return sq_throwerror(v, _SC("invalid typemask"));
        nc->_typecheck.copy(res);
    }
    else {
        nc->_typecheck.resize(0);
    }
    if(nparamscheck == SQ_MATCHTYPEMASKSTRING) {
        nc->_nparamscheck = nc->_typecheck.size();
    }
    return SQ_OK;
}